

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::opReturn(PrintC *this,PcodeOp *op)

{
  EmitXml *pEVar1;
  uint4 uVar2;
  int4 iVar3;
  Varnode *vn;
  allocator local_b9;
  string local_b8 [32];
  Atom local_98;
  Atom local_70;
  undefined4 local_48;
  string local_38 [8];
  string nm;
  PcodeOp *op_local;
  PrintC *this_local;
  
  std::__cxx11::string::string(local_38);
  uVar2 = PcodeOp::getHaltType(op);
  if (uVar2 == 0x200000) {
LAB_0069fbc4:
    std::__cxx11::string::operator=(local_38,"halt");
  }
  else if (uVar2 == 0x400000) {
    std::__cxx11::string::operator=(local_38,"halt_baddata");
  }
  else if (uVar2 == 0x800000) {
    std::__cxx11::string::operator=(local_38,"halt_unimplemented");
  }
  else {
    if (uVar2 == 0x1000000) goto LAB_0069fbc4;
    if (uVar2 != 0x2000000) {
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x13])(pEVar1,"return",0,op);
      iVar3 = PcodeOp::numInput(op);
      if (1 < iVar3) {
        pEVar1 = (this->super_PrintLanguage).emit;
        (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
        vn = PcodeOp::getIn(op,1);
        PrintLanguage::pushVnImplied
                  (&this->super_PrintLanguage,vn,op,(this->super_PrintLanguage).mods);
      }
      local_48 = 1;
      goto LAB_0069fcdb;
    }
    std::__cxx11::string::operator=(local_38,"halt_missing");
  }
  PrintLanguage::pushOp(&this->super_PrintLanguage,&function_call,op);
  PrintLanguage::Atom::Atom(&local_70,(string *)local_38,optoken,funcname_color,op);
  PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  PrintLanguage::Atom::Atom(&local_98,(string *)local_b8,blanktoken,no_color);
  PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_48 = 0;
LAB_0069fcdb:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PrintC::opReturn(const PcodeOp *op)

{
  string nm;
  switch(op->getHaltType()) {
  default:			// The most common case, plain return
  // FIXME:  This routine shouldn't emit directly
    emit->tagOp("return",EmitXml::keyword_color,op);
    if (op->numInput()>1) {
      emit->spaces(1);
      pushVnImplied(op->getIn(1),op,mods);
    }
    return;
  case PcodeOp::noreturn:	// Previous instruction does not exit
  case PcodeOp::halt:		// Process halts
    nm = "halt";
    break;
  case PcodeOp::badinstruction:
    nm = "halt_baddata";	// CPU executes bad instruction
    break;
  case PcodeOp::unimplemented:	// instruction is unimplemented
    nm = "halt_unimplemented";
    break;
  case PcodeOp::missing:	// Did not analyze this instruction
    nm = "halt_missing";
    break;
  }
  pushOp(&function_call,op);
  pushAtom(Atom(nm,optoken,EmitXml::funcname_color,op));
  pushAtom(Atom("",blanktoken,EmitXml::no_color));
}